

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000017cf90 = 0x2e2e2e2e2e2e2e;
    uRam000000000017cf97._0_1_ = '.';
    uRam000000000017cf97._1_1_ = '.';
    uRam000000000017cf97._2_1_ = '.';
    uRam000000000017cf97._3_1_ = '.';
    uRam000000000017cf97._4_1_ = '.';
    uRam000000000017cf97._5_1_ = '.';
    uRam000000000017cf97._6_1_ = '.';
    uRam000000000017cf97._7_1_ = '.';
    DAT_0017cf80 = '.';
    DAT_0017cf80_1._0_1_ = '.';
    DAT_0017cf80_1._1_1_ = '.';
    DAT_0017cf80_1._2_1_ = '.';
    DAT_0017cf80_1._3_1_ = '.';
    DAT_0017cf80_1._4_1_ = '.';
    DAT_0017cf80_1._5_1_ = '.';
    DAT_0017cf80_1._6_1_ = '.';
    uRam000000000017cf88 = 0x2e2e2e2e2e2e2e;
    DAT_0017cf8f = 0x2e;
    DAT_0017cf70 = '.';
    DAT_0017cf70_1._0_1_ = '.';
    DAT_0017cf70_1._1_1_ = '.';
    DAT_0017cf70_1._2_1_ = '.';
    DAT_0017cf70_1._3_1_ = '.';
    DAT_0017cf70_1._4_1_ = '.';
    DAT_0017cf70_1._5_1_ = '.';
    DAT_0017cf70_1._6_1_ = '.';
    uRam000000000017cf78._0_1_ = '.';
    uRam000000000017cf78._1_1_ = '.';
    uRam000000000017cf78._2_1_ = '.';
    uRam000000000017cf78._3_1_ = '.';
    uRam000000000017cf78._4_1_ = '.';
    uRam000000000017cf78._5_1_ = '.';
    uRam000000000017cf78._6_1_ = '.';
    uRam000000000017cf78._7_1_ = '.';
    DAT_0017cf60 = '.';
    DAT_0017cf60_1._0_1_ = '.';
    DAT_0017cf60_1._1_1_ = '.';
    DAT_0017cf60_1._2_1_ = '.';
    DAT_0017cf60_1._3_1_ = '.';
    DAT_0017cf60_1._4_1_ = '.';
    DAT_0017cf60_1._5_1_ = '.';
    DAT_0017cf60_1._6_1_ = '.';
    uRam000000000017cf68._0_1_ = '.';
    uRam000000000017cf68._1_1_ = '.';
    uRam000000000017cf68._2_1_ = '.';
    uRam000000000017cf68._3_1_ = '.';
    uRam000000000017cf68._4_1_ = '.';
    uRam000000000017cf68._5_1_ = '.';
    uRam000000000017cf68._6_1_ = '.';
    uRam000000000017cf68._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam000000000017cf58._0_1_ = '.';
    uRam000000000017cf58._1_1_ = '.';
    uRam000000000017cf58._2_1_ = '.';
    uRam000000000017cf58._3_1_ = '.';
    uRam000000000017cf58._4_1_ = '.';
    uRam000000000017cf58._5_1_ = '.';
    uRam000000000017cf58._6_1_ = '.';
    uRam000000000017cf58._7_1_ = '.';
    DAT_0017cf9f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}